

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SkipList.cpp
# Opt level: O0

int __thiscall SkipList::randomHeight(SkipList *this)

{
  bool bVar1;
  int iVar2;
  int local_14;
  int rand_height;
  SkipList *this_local;
  
  local_14 = 0;
  srand(10000);
  while( true ) {
    iVar2 = std::experimental::fundamentals_v2::randint<int>(0,10000);
    bVar1 = false;
    if (iVar2 < 5000) {
      bVar1 = local_14 < this->MAX_HEIGHT;
    }
    if (!bVar1) break;
    local_14 = local_14 + 1;
  }
  return local_14;
}

Assistant:

int SkipList::randomHeight() {
    int rand_height = 0;
    std::srand(10000);
    while (std::experimental::randint(0, 10000) < 5000 && rand_height < MAX_HEIGHT) {
        ++rand_height;
    }
    return rand_height;
}